

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyRender.cpp
# Opt level: O2

void __thiscall
TRM::TinyRender::triangle(TinyRender *this,Vec2i *a,Vec2i *b,Vec2i *c,TGAColor *color)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  anon_union_4_3_4e90da17_for_vec<2,_int,_(glm::qualifier)0>_3 x;
  int iVar5;
  vec<2,_int,_(glm::qualifier)0> *this_00;
  int j;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 extraout_XMM0_Db;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 extraout_XMM0_Db_00;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aVar6;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 extraout_XMM0_Db_01;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 extraout_XMM0_Dc;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 extraout_XMM0_Dc_00;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 extraout_XMM0_Dc_01;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 extraout_XMM0_Dc_02;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aVar7;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 extraout_XMM0_Dd;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 extraout_XMM0_Dd_00;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 extraout_XMM0_Dd_01;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 extraout_XMM0_Dd_02;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aVar8;
  Vec3f VVar9;
  Vec2i bboxmax;
  Vec2i bboxmin;
  Vec2i clamp;
  Vec2i pts [3];
  anon_union_4_3_4e90da17_for_vec<2,_int,_(glm::qualifier)0>_3 local_98;
  anon_union_4_3_4e90b0ec_for_vec<2,_int,_(glm::qualifier)0>_5 aStackY_94;
  anon_union_4_3_4e90da17_for_vec<2,_int,_(glm::qualifier)0>_3 local_90;
  int local_8c;
  undefined8 local_88;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStackY_80;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStackY_7c;
  vec<2,_float,_(glm::qualifier)0> P;
  anon_union_4_3_4e90da17_for_vec<2,_int,_(glm::qualifier)0>_3 local_50;
  int local_4c;
  Vec2i local_48 [3];
  
  local_48[0] = *a;
  local_48[1] = *b;
  local_48[2] = *c;
  iVar1 = TGAImage::get_width(*(TGAImage **)(this + 8));
  local_8c = TGAImage::get_height(*(TGAImage **)(this + 8));
  local_8c = local_8c + -1;
  _local_98 = 0;
  local_90.x = iVar1 + -1;
  iVar1 = TGAImage::get_width(*(TGAImage **)(this + 8));
  local_4c = TGAImage::get_height(*(TGAImage **)(this + 8));
  local_4c = local_4c + -1;
  aVar6 = extraout_XMM0_Db;
  aVar7 = extraout_XMM0_Dc;
  aVar8 = extraout_XMM0_Dd;
  local_50.x = iVar1 + -1;
  for (local_88 = 0; x = local_90, P = (vec<2,_float,_(glm::qualifier)0>)color, local_88 != 3;
      local_88 = local_88 + 1) {
    this_00 = local_48 + local_88;
    for (iVar1 = 0; iVar1 != 2; iVar1 = iVar1 + 1) {
      piVar2 = glm::vec<2,_int,_(glm::qualifier)0>::operator[]
                         ((vec<2,_int,_(glm::qualifier)0> *)&local_90,iVar1);
      piVar3 = glm::vec<2,_int,_(glm::qualifier)0>::operator[](this_00,iVar1);
      iVar5 = *piVar2;
      if (*piVar3 < *piVar2) {
        iVar5 = *piVar3;
      }
      if (iVar5 < 1) {
        iVar5 = 0;
      }
      piVar2 = glm::vec<2,_int,_(glm::qualifier)0>::operator[]
                         ((vec<2,_int,_(glm::qualifier)0> *)&local_90,iVar1);
      *piVar2 = iVar5;
      piVar2 = glm::vec<2,_int,_(glm::qualifier)0>::operator[]
                         ((vec<2,_int,_(glm::qualifier)0> *)&local_50,iVar1);
      piVar3 = glm::vec<2,_int,_(glm::qualifier)0>::operator[]
                         ((vec<2,_int,_(glm::qualifier)0> *)&local_98,iVar1);
      piVar4 = glm::vec<2,_int,_(glm::qualifier)0>::operator[](this_00,iVar1);
      iVar5 = *piVar4;
      if (*piVar4 < *piVar3) {
        iVar5 = *piVar3;
      }
      if (*piVar2 <= iVar5) {
        iVar5 = *piVar2;
      }
      piVar2 = glm::vec<2,_int,_(glm::qualifier)0>::operator[]
                         ((vec<2,_int,_(glm::qualifier)0> *)&local_98,iVar1);
      *piVar2 = iVar5;
      aVar6 = extraout_XMM0_Db_00;
      aVar7 = extraout_XMM0_Dc_00;
      aVar8 = extraout_XMM0_Dd_00;
    }
  }
  for (; x.x <= local_98.x; x.x = x.x + 1) {
    local_88 = CONCAT44(aVar6,(float)x.x);
    aStackY_80 = aVar7;
    aStackY_7c = aVar8;
    for (iVar1 = local_8c; iVar1 <= aStackY_94.y; iVar1 = iVar1 + 1) {
      VVar9 = barycentric<2ul>((vec<2,_float,_(glm::qualifier)0>)a,
                               (vec<2,_float,_(glm::qualifier)0>)this,
                               (vec<2,_float,_(glm::qualifier)0>)c,P);
      aVar6 = VVar9.field_1;
      aVar7 = extraout_XMM0_Dc_01;
      aVar8 = extraout_XMM0_Dd_01;
      if (((0.0 <= VVar9.field_0.x) && (aVar7 = aVar6, aVar8 = aVar6, 0.0 <= aVar6.y)) &&
         (0.0 <= VVar9.field_2.z)) {
        TGAImage::set(*(TGAImage **)((long)this + 8),x.x,iVar1,color);
        aVar6 = extraout_XMM0_Db_01;
        aVar7 = extraout_XMM0_Dc_02;
        aVar8 = extraout_XMM0_Dd_02;
      }
    }
  }
  return;
}

Assistant:

void TinyRender::triangle(const Vec2i& a, const Vec2i& b, const Vec2i& c,
                          const TGAColor& color) {
  Vec2i pts[] = {a, b, c};

  Vec2i bboxmin(this->mImage->get_width() - 1, this->mImage->get_height() - 1);
  Vec2i bboxmax(0, 0);
  Vec2i clamp(this->mImage->get_width() - 1, this->mImage->get_height() - 1);
  for (int i = 0; i < 3; i++) {
    for (int j = 0; j < 2; j++) {
      bboxmin[j] = std::max(0, std::min(bboxmin[j], pts[i][j]));
      bboxmax[j] = std::min(clamp[j], std::max(bboxmax[j], pts[i][j]));
    }
  }

  Vec2i p;
  for (p[0] = bboxmin.x; p[0] <= bboxmax.x; p[0]++) {
    for (p[1] = bboxmin.y; p[1] <= bboxmax.y; p[1]++) {
      Vec3f bc_screen = barycentric<2>(a, b, c, p);
      if (bc_screen[0] < 0 || bc_screen[1] < 0 || bc_screen[2] < 0) continue;

      mImage->set(p[0], p[1], color);
    }
  }
}